

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow.cpp
# Opt level: O1

bool PermittedDifficultyTransition
               (Params *params,int64_t height,uint32_t old_nbits,uint32_t new_nbits)

{
  long lVar1;
  int iVar2;
  uint32_t uVar3;
  bool bVar4;
  long lVar5;
  long in_FS_OFFSET;
  arith_uint256 minimum_new_target;
  arith_uint256 smallest_difficulty_target;
  arith_uint256 maximum_new_target;
  arith_uint256 largest_difficulty_target;
  arith_uint256 observed_new_target;
  arith_uint256 pow_limit;
  base_uint<256U> local_f8;
  base_uint<256U> local_d8;
  base_uint<256U> local_b8;
  base_uint<256U> local_98;
  base_uint<256U> local_78;
  base_uint<256U> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = true;
  if (params->fPowAllowMinDifficultyBlocks != false) goto LAB_00288642;
  lVar1 = params->nPowTargetTimespan;
  if (height % (lVar1 / params->nPowTargetSpacing) == 0) {
    lVar5 = lVar1 + 3;
    if (-1 < lVar1) {
      lVar5 = lVar1;
    }
    UintToArith256((arith_uint256 *)&local_58,&params->powLimit);
    local_78.pn[4] = 0;
    local_78.pn[5] = 0;
    local_78.pn[6] = 0;
    local_78.pn[7] = 0;
    local_78.pn[0] = 0;
    local_78.pn[1] = 0;
    local_78.pn[2] = 0;
    local_78.pn[3] = 0;
    arith_uint256::SetCompact((arith_uint256 *)&local_78,new_nbits,(bool *)0x0,(bool *)0x0);
    local_98.pn[4] = 0;
    local_98.pn[5] = 0;
    local_98.pn[6] = 0;
    local_98.pn[7] = 0;
    local_98.pn[0] = 0;
    local_98.pn[1] = 0;
    local_98.pn[2] = 0;
    local_98.pn[3] = 0;
    arith_uint256::SetCompact((arith_uint256 *)&local_98,old_nbits,(bool *)0x0,(bool *)0x0);
    base_uint<256U>::operator*=(&local_98,(int)lVar1 << 2);
    local_b8.pn._0_8_ = params->nPowTargetTimespan;
    local_b8.pn[2] = 0;
    local_b8.pn[3] = 0;
    local_b8.pn[4] = 0;
    local_b8.pn[5] = 0;
    local_b8.pn[6] = 0;
    local_b8.pn[7] = 0;
    base_uint<256U>::operator/=(&local_98,&local_b8);
    iVar2 = base_uint<256U>::CompareTo(&local_98,&local_58);
    if (0 < iVar2) {
      local_98.pn[4] = local_58.pn[4];
      local_98.pn[5] = local_58.pn[5];
      local_98.pn[6] = local_58.pn[6];
      local_98.pn[7] = local_58.pn[7];
      local_98.pn[0] = local_58.pn[0];
      local_98.pn[1] = local_58.pn[1];
      local_98.pn[2] = local_58.pn[2];
      local_98.pn[3] = local_58.pn[3];
    }
    local_b8.pn[4] = 0;
    local_b8.pn[5] = 0;
    local_b8.pn[6] = 0;
    local_b8.pn[7] = 0;
    local_b8.pn[0] = 0;
    local_b8.pn[1] = 0;
    local_b8.pn[2] = 0;
    local_b8.pn[3] = 0;
    uVar3 = arith_uint256::GetCompact((arith_uint256 *)&local_98,false);
    arith_uint256::SetCompact((arith_uint256 *)&local_b8,uVar3,(bool *)0x0,(bool *)0x0);
    iVar2 = base_uint<256U>::CompareTo(&local_b8,&local_78);
    if (-1 < iVar2) {
      local_d8.pn[4] = 0;
      local_d8.pn[5] = 0;
      local_d8.pn[6] = 0;
      local_d8.pn[7] = 0;
      local_d8.pn[0] = 0;
      local_d8.pn[1] = 0;
      local_d8.pn[2] = 0;
      local_d8.pn[3] = 0;
      arith_uint256::SetCompact((arith_uint256 *)&local_d8,old_nbits,(bool *)0x0,(bool *)0x0);
      base_uint<256U>::operator*=(&local_d8,(uint32_t)(lVar5 >> 2));
      local_f8.pn._0_8_ = params->nPowTargetTimespan;
      local_f8.pn[2] = 0;
      local_f8.pn[3] = 0;
      local_f8.pn[4] = 0;
      local_f8.pn[5] = 0;
      local_f8.pn[6] = 0;
      local_f8.pn[7] = 0;
      base_uint<256U>::operator/=(&local_d8,&local_f8);
      iVar2 = base_uint<256U>::CompareTo(&local_d8,&local_58);
      if (0 < iVar2) {
        local_d8.pn[4] = local_58.pn[4];
        local_d8.pn[5] = local_58.pn[5];
        local_d8.pn[6] = local_58.pn[6];
        local_d8.pn[7] = local_58.pn[7];
        local_d8.pn[0] = local_58.pn[0];
        local_d8.pn[1] = local_58.pn[1];
        local_d8.pn[2] = local_58.pn[2];
        local_d8.pn[3] = local_58.pn[3];
      }
      local_f8.pn[4] = 0;
      local_f8.pn[5] = 0;
      local_f8.pn[6] = 0;
      local_f8.pn[7] = 0;
      local_f8.pn[0] = 0;
      local_f8.pn[1] = 0;
      local_f8.pn[2] = 0;
      local_f8.pn[3] = 0;
      bVar4 = false;
      uVar3 = arith_uint256::GetCompact((arith_uint256 *)&local_d8,false);
      arith_uint256::SetCompact((arith_uint256 *)&local_f8,uVar3,(bool *)0x0,(bool *)0x0);
      iVar2 = base_uint<256U>::CompareTo(&local_f8,&local_78);
      if (0 < iVar2) goto LAB_00288642;
      goto LAB_0028863a;
    }
  }
  else if (old_nbits == new_nbits) {
LAB_0028863a:
    bVar4 = true;
    goto LAB_00288642;
  }
  bVar4 = false;
LAB_00288642:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool PermittedDifficultyTransition(const Consensus::Params& params, int64_t height, uint32_t old_nbits, uint32_t new_nbits)
{
    if (params.fPowAllowMinDifficultyBlocks) return true;

    if (height % params.DifficultyAdjustmentInterval() == 0) {
        int64_t smallest_timespan = params.nPowTargetTimespan/4;
        int64_t largest_timespan = params.nPowTargetTimespan*4;

        const arith_uint256 pow_limit = UintToArith256(params.powLimit);
        arith_uint256 observed_new_target;
        observed_new_target.SetCompact(new_nbits);

        // Calculate the largest difficulty value possible:
        arith_uint256 largest_difficulty_target;
        largest_difficulty_target.SetCompact(old_nbits);
        largest_difficulty_target *= largest_timespan;
        largest_difficulty_target /= params.nPowTargetTimespan;

        if (largest_difficulty_target > pow_limit) {
            largest_difficulty_target = pow_limit;
        }

        // Round and then compare this new calculated value to what is
        // observed.
        arith_uint256 maximum_new_target;
        maximum_new_target.SetCompact(largest_difficulty_target.GetCompact());
        if (maximum_new_target < observed_new_target) return false;

        // Calculate the smallest difficulty value possible:
        arith_uint256 smallest_difficulty_target;
        smallest_difficulty_target.SetCompact(old_nbits);
        smallest_difficulty_target *= smallest_timespan;
        smallest_difficulty_target /= params.nPowTargetTimespan;

        if (smallest_difficulty_target > pow_limit) {
            smallest_difficulty_target = pow_limit;
        }

        // Round and then compare this new calculated value to what is
        // observed.
        arith_uint256 minimum_new_target;
        minimum_new_target.SetCompact(smallest_difficulty_target.GetCompact());
        if (minimum_new_target > observed_new_target) return false;
    } else if (old_nbits != new_nbits) {
        return false;
    }
    return true;
}